

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O2

int init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int in_EAX;
  undefined8 *puVar2;
  
  if (g_gl.clocks[0] != (djg_clock *)0x0) {
    djgc_release(g_gl.clocks[0]);
  }
  g_gl.clocks[0] = djgc_create();
  bVar1 = loadTextures();
  if (bVar1) {
    bVar1 = loadBuffers();
    if (bVar1) {
      bVar1 = loadFramebuffers();
      if (bVar1) {
        bVar1 = loadVertexArrays();
        if (bVar1) {
          bVar1 = loadPrograms();
          if (bVar1) {
            return in_EAX;
          }
        }
      }
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = std::__cxx11::string::operator=;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

void init()
{
    bool v = true;
    int i;

    for (i = 0; i < CLOCK_COUNT; ++i) {
        if (g_gl.clocks[i])
            djgc_release(g_gl.clocks[i]);
        g_gl.clocks[i] = djgc_create();
    }

    if (v) v&= loadTextures();
    if (v) v&= loadBuffers();
    if (v) v&= loadFramebuffers();
    if (v) v&= loadVertexArrays();
    if (v) v&= loadPrograms();

    if (!v) throw std::exception();
}